

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkIvyAfter(Abc_Ntk_t *pNtk,Ivy_Man_t *pMan,int fSeq,int fHaig)

{
  ulong uVar1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar2;
  int iVar3;
  uint uVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar5;
  void *pvVar6;
  Ivy_Obj_t *pIVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pObj;
  Vec_Int_t *pVVar9;
  Abc_Ntk_t *pAVar10;
  int iVar11;
  char *__ptr;
  Ivy_Obj_t *pIVar12;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aStack_60;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Abc_Ntk_t *local_38;
  
  if (fSeq == 0) {
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pAVar5 = Abc_AigConst1(pNtk_00);
    pMan->pConst1->TravId =
         ((uint)pAVar5 & 1) + *(int *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x10) * 2;
    for (iVar11 = 0; iVar11 < pNtk->vCis->nSize; iVar11 = iVar11 + 1) {
      pAVar5 = Abc_NtkCi(pNtk,iVar11);
      aVar2 = pAVar5->field_6;
      iVar3 = *(int *)(((ulong)aVar2.pTemp & 0xfffffffffffffffe) + 0x10);
      pIVar7 = Ivy_ManPi(pMan,iVar11);
      pIVar7->TravId = (aVar2.iTemp & 1U) + iVar3 * 2;
    }
    pVVar9 = Ivy_ManDfs(pMan);
    for (iVar11 = 0; iVar11 < pVVar9->nSize; iVar11 = iVar11 + 1) {
      iVar3 = Vec_IntEntry(pVVar9,iVar11);
      pIVar7 = Ivy_ManObj(pMan,iVar3);
      if (pIVar7 == (Ivy_Obj_t *)0x0) break;
      pAVar5 = Abc_ObjFanin0Ivy(pNtk_00,pIVar7);
      if ((*(uint *)&pIVar7->field_0x8 & 0xf) == 7) {
        iVar3 = ((uint)pAVar5 & 1) + *(int *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x10) * 2;
      }
      else {
        pAVar8 = Abc_ObjFanin1Ivy(pNtk_00,pIVar7);
        if ((*(uint *)&pIVar7->field_0x8 & 0xf) == 6) {
          pAVar5 = Abc_AigXor((Abc_Aig_t *)pNtk_00->pManFunc,pAVar5,pAVar8);
        }
        else {
          pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar5,pAVar8);
        }
        iVar3 = ((uint)pAVar5 & 1) + *(int *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x10) * 2;
      }
      pIVar7->TravId = iVar3;
    }
    for (iVar11 = 0; iVar11 < pNtk->vCos->nSize; iVar11 = iVar11 + 1) {
      pAVar5 = Abc_NtkCo(pNtk,iVar11);
      pIVar7 = Ivy_ManPo(pMan,iVar11);
      pAVar8 = Abc_ObjFanin0Ivy(pNtk_00,pIVar7);
      Abc_ObjAddFanin((pAVar5->field_6).pCopy,pAVar8);
    }
    Vec_IntFree(pVVar9);
    iVar11 = Abc_NtkCheck(pNtk_00);
    if (iVar11 != 0) goto LAB_00251c61;
    __ptr = "Abc_NtkFromIvy(): Network check has failed.\n";
    aStack_60 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2c;
  }
  else {
    pNtk_00 = Abc_NtkStartFromNoLatches(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pAVar5 = Abc_AigConst1(pNtk_00);
    pMan->pConst1->TravId =
         ((uint)pAVar5 & 1) + *(int *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x10) * 2;
    for (iVar11 = 0; iVar11 < pNtk->vPis->nSize; iVar11 = iVar11 + 1) {
      pvVar6 = Vec_PtrEntry(pNtk->vPis,iVar11);
      uVar1 = *(ulong *)((long)pvVar6 + 0x40);
      iVar3 = *(int *)((uVar1 & 0xfffffffffffffffe) + 0x10);
      pIVar7 = Ivy_ManPi(pMan,iVar11);
      pIVar7->TravId = ((uint)uVar1 & 1) + iVar3 * 2;
    }
    local_38 = pNtk;
    local_40 = Ivy_ManDfsSeq(pMan,&local_48);
    for (iVar11 = 0; pVVar9 = local_40, iVar11 < local_48->nSize; iVar11 = iVar11 + 1) {
      iVar3 = Vec_IntEntry(local_48,iVar11);
      pIVar7 = Ivy_ManObj(pMan,iVar3);
      if (pIVar7 == (Ivy_Obj_t *)0x0) break;
      pAVar5 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_LATCH);
      pAVar8 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BI);
      pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BO);
      Abc_ObjAddFanin(pAVar5,pAVar8);
      Abc_ObjAddFanin(pObj,pAVar5);
      if (fHaig == 0) {
        switch(*(uint *)&pIVar7->field_0x8 >> 9 & 3) {
        case 0:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                        ,0x33c,"Abc_Ntk_t *Abc_NtkFromIvySeq(Abc_Ntk_t *, Ivy_Man_t *, int)");
        case 1:
          aStack_60 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
          if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                          ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
          }
          break;
        case 2:
          aStack_60 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
          if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                          ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
          }
          break;
        case 3:
          goto switchD_002518b0_caseD_3;
        }
      }
      else {
switchD_002518b0_caseD_3:
        aStack_60 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                        ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
        }
      }
      pAVar5->field_5 = aStack_60;
      pIVar7->TravId = ((uint)pObj & 1) + *(int *)(((ulong)pObj & 0xfffffffffffffffe) + 0x10) * 2;
    }
    Abc_NtkAddDummyBoxNames(pNtk_00);
    for (iVar11 = 0; iVar11 < pVVar9->nSize; iVar11 = iVar11 + 1) {
      iVar3 = Vec_IntEntry(pVVar9,iVar11);
      pIVar7 = Ivy_ManObj(pMan,iVar3);
      if (pIVar7 == (Ivy_Obj_t *)0x0) break;
      pAVar5 = Abc_ObjFanin0Ivy(pNtk_00,pIVar7);
      if ((*(uint *)&pIVar7->field_0x8 & 0xf) == 7) {
        pIVar7->TravId =
             ((uint)pAVar5 & 1) + *(int *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x10) * 2;
      }
      else {
        pAVar8 = Abc_ObjFanin1Ivy(pNtk_00,pIVar7);
        if ((*(uint *)&pIVar7->field_0x8 & 0xf) == 6) {
          pAVar5 = Abc_AigXor((Abc_Aig_t *)pNtk_00->pManFunc,pAVar5,pAVar8);
        }
        else {
          pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar5,pAVar8);
        }
        iVar3 = ((uint)pAVar5 & 1) + *(int *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x10) * 2;
        pIVar7->TravId = iVar3;
        if (((fHaig != 0) && (pIVar7->pEquiv != (Ivy_Obj_t *)0x0)) && (0 < pIVar7->nRefs)) {
          pAVar5 = Abc_EdgeToNode(pNtk_00,iVar3);
          pIVar12 = pIVar7->pEquiv;
          if (((ulong)pIVar12 & 1) != 0) {
            __assert_fail("!Ivy_IsComplement(pNode->pEquiv)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                          ,0x357,"Abc_Ntk_t *Abc_NtkFromIvySeq(Abc_Ntk_t *, Ivy_Man_t *, int)");
          }
          for (; pIVar12 != pIVar7;
              pIVar12 = (Ivy_Obj_t *)((ulong)pIVar12->pEquiv & 0xfffffffffffffffe)) {
            pAVar8 = Abc_EdgeToNode(pNtk_00,pIVar12->TravId);
            (pAVar5->field_5).pData = pAVar8;
            pAVar5 = pAVar8;
          }
          (pAVar5->field_5).pData = (void *)0x0;
        }
      }
    }
    pNtk = local_38;
    for (iVar11 = 0; iVar11 < pNtk->vPos->nSize; iVar11 = iVar11 + 1) {
      pAVar5 = Abc_NtkPo(pNtk,iVar11);
      pIVar7 = Ivy_ManPo(pMan,iVar11);
      pAVar8 = Abc_ObjFanin0Ivy(pNtk_00,pIVar7);
      Abc_ObjAddFanin((pAVar5->field_6).pCopy,pAVar8);
    }
    for (iVar11 = 0; iVar11 < local_48->nSize; iVar11 = iVar11 + 1) {
      iVar3 = Vec_IntEntry(local_48,iVar11);
      pIVar7 = Ivy_ManObj(pMan,iVar3);
      if (pIVar7 == (Ivy_Obj_t *)0x0) break;
      pAVar5 = Abc_ObjFanin0Ivy(pNtk_00,pIVar7);
      pAVar8 = Abc_NtkBox(pNtk_00,iVar11);
      Abc_ObjAddFanin((Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray],pAVar5);
    }
    Vec_IntFree(local_48);
    Vec_IntFree(local_40);
    iVar11 = Abc_NtkCheck(pNtk_00);
    if (iVar11 != 0) goto LAB_00251c61;
    __ptr = "Abc_NtkFromIvySeq(): Network check has failed.\n";
    aStack_60 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2f;
  }
  fwrite(__ptr,(size_t)aStack_60,1,_stdout);
LAB_00251c61:
  if ((fHaig == 0) && (uVar4 = Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc), uVar4 != 0)) {
    printf("Warning: AIG cleanup removed %d nodes (this is not a bug).\n",(ulong)uVar4);
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar10 = Abc_NtkDup(pNtk->pExdc);
    pNtk_00->pExdc = pAVar10;
  }
  iVar11 = Abc_NtkCheck(pNtk_00);
  if (iVar11 == 0) {
    puts("Abc_NtkStrash: The network check has failed.");
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyAfter( Abc_Ntk_t * pNtk, Ivy_Man_t * pMan, int fSeq, int fHaig )
{
    Abc_Ntk_t * pNtkAig;
    int nNodes, fCleanup = 1;
    // convert from the AIG manager
    if ( fSeq )
        pNtkAig = Abc_NtkFromIvySeq( pNtk, pMan, fHaig );
    else
        pNtkAig = Abc_NtkFromIvy( pNtk, pMan );
    // report the cleanup results
    if ( !fHaig && fCleanup && (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) )
        printf( "Warning: AIG cleanup removed %d nodes (this is not a bug).\n", nNodes );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}